

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b(uint8_t *out,void *in,void *key,uint8_t outlen,uint64_t inlen,uint8_t keylen)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char in_R9B;
  blake2b_state S [1];
  uint64_t in_stack_fffffffffffffdc8;
  uint8_t *in_stack_fffffffffffffdd0;
  blake2b_state *in_stack_fffffffffffffdd8;
  uint8_t in_stack_fffffffffffffdff;
  blake2b_state *in_stack_fffffffffffffe00;
  blake2b_state *in_stack_fffffffffffffe08;
  uint8_t in_stack_fffffffffffffe7f;
  void *in_stack_fffffffffffffe80;
  uint8_t in_stack_fffffffffffffe8f;
  blake2b_state *in_stack_fffffffffffffe90;
  char local_81;
  int local_54;
  
  if (in_RSI == 0) {
    local_54 = -1;
  }
  else if (in_RDI == 0) {
    local_54 = -1;
  }
  else {
    local_81 = in_R9B;
    if (in_RDX == 0) {
      local_81 = '\0';
    }
    if (local_81 == '\0') {
      iVar1 = blake2b_init(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
      if (iVar1 < 0) {
        return -1;
      }
    }
    else {
      iVar1 = blake2b_init_key(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f,
                               in_stack_fffffffffffffe80,in_stack_fffffffffffffe7f);
      if (iVar1 < 0) {
        return -1;
      }
    }
    blake2b_update(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    blake2b_final(in_stack_fffffffffffffe08,(uint8_t *)in_stack_fffffffffffffe00,
                  in_stack_fffffffffffffdff);
    local_54 = 0;
  }
  return local_54;
}

Assistant:

int blake2b( uint8_t *out, const void *in, const void *key, const uint8_t outlen, const uint64_t inlen, uint8_t keylen )
{
  blake2b_state S[1];

  /* Verify parameters */
  if ( NULL == in ) return -1;

  if ( NULL == out ) return -1;

  if( NULL == key ) keylen = 0;

  if( keylen > 0 )
  {
    if( blake2b_init_key( S, outlen, key, keylen ) < 0 ) return -1;
  }
  else
  {
    if( blake2b_init( S, outlen ) < 0 ) return -1;
  }

  blake2b_update( S, ( uint8_t * )in, inlen );
  blake2b_final( S, out, outlen );
  return 0;
}